

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool accountingDiffTolerated
                   (XML_Parser originParser,int tok,char *before,char *after,int source_line,
                   XML_Account account)

{
  XmlBigCount XVar1;
  XmlBigCount XVar2;
  XML_Parser rootParser_00;
  long bytesMore_00;
  float fVar3;
  bool local_81;
  ACCOUNTING *local_80;
  XML_Bool tolerated;
  float amplificationFactor;
  XmlBigCount countBytesOutput;
  XmlBigCount *additionTarget;
  ptrdiff_t bytesMore;
  int isDirect;
  XML_Parser rootParser;
  XML_Account local_38;
  uint levelsAwayFromRootParser;
  XML_Account account_local;
  int source_line_local;
  char *after_local;
  char *before_local;
  XML_Parser pXStack_18;
  int tok_local;
  XML_Parser originParser_local;
  
  if ((tok == -4) || (tok + 2U < 3)) {
    originParser_local._7_1_ = true;
  }
  else if (account == XML_ACCOUNT_NONE) {
    originParser_local._7_1_ = true;
  }
  else {
    local_38 = account;
    levelsAwayFromRootParser = source_line;
    _account_local = after;
    after_local = before;
    before_local._4_4_ = tok;
    pXStack_18 = originParser;
    rootParser_00 = getRootParserOf(originParser,(uint *)((long)&rootParser + 4));
    if (rootParser_00->m_parentParser != (XML_Parser)0x0) {
      __assert_fail("! rootParser->m_parentParser",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                    ,0x1eed,
                    "XML_Bool accountingDiffTolerated(XML_Parser, int, const char *, const char *, int, enum XML_Account)"
                   );
    }
    bytesMore_00 = (long)_account_local - (long)after_local;
    if (local_38 == XML_ACCOUNT_DIRECT && pXStack_18 == rootParser_00) {
      local_80 = &rootParser_00->m_accounting;
    }
    else {
      local_80 = (ACCOUNTING *)&(rootParser_00->m_accounting).countBytesIndirect;
    }
    if (-bytesMore_00 - 1U < local_80->countBytesDirect) {
      originParser_local._7_1_ = false;
    }
    else {
      local_80->countBytesDirect = bytesMore_00 + local_80->countBytesDirect;
      XVar1 = (rootParser_00->m_accounting).countBytesDirect;
      XVar2 = (rootParser_00->m_accounting).countBytesIndirect;
      fVar3 = accountingGetCurrentAmplification(rootParser_00);
      local_81 = true;
      if ((rootParser_00->m_accounting).activationThresholdBytes <= XVar1 + XVar2) {
        local_81 = fVar3 <= (rootParser_00->m_accounting).maximumAmplificationFactor;
      }
      if (1 < (rootParser_00->m_accounting).debugLevel) {
        accountingReportStats(rootParser_00,"");
        accountingReportDiff
                  (rootParser_00,rootParser._4_4_,after_local,_account_local,bytesMore_00,
                   levelsAwayFromRootParser,local_38);
      }
      originParser_local._7_1_ = local_81;
    }
  }
  return originParser_local._7_1_;
}

Assistant:

static XML_Bool
accountingDiffTolerated(XML_Parser originParser, int tok, const char *before,
                        const char *after, int source_line,
                        enum XML_Account account) {
  /* Note: We need to check the token type *first* to be sure that
   *       we can even access variable <after>, safely.
   *       E.g. for XML_TOK_NONE <after> may hold an invalid pointer. */
  switch (tok) {
  case XML_TOK_INVALID:
  case XML_TOK_PARTIAL:
  case XML_TOK_PARTIAL_CHAR:
  case XML_TOK_NONE:
    return XML_TRUE;
  }

  if (account == XML_ACCOUNT_NONE)
    return XML_TRUE; /* because these bytes have been accounted for, already */

  unsigned int levelsAwayFromRootParser;
  const XML_Parser rootParser
      = getRootParserOf(originParser, &levelsAwayFromRootParser);
  assert(! rootParser->m_parentParser);

  const int isDirect
      = (account == XML_ACCOUNT_DIRECT) && (originParser == rootParser);
  const ptrdiff_t bytesMore = after - before;

  XmlBigCount *const additionTarget
      = isDirect ? &rootParser->m_accounting.countBytesDirect
                 : &rootParser->m_accounting.countBytesIndirect;

  /* Detect and avoid integer overflow */
  if (*additionTarget > (XmlBigCount)(-1) - (XmlBigCount)bytesMore)
    return XML_FALSE;
  *additionTarget += bytesMore;

  const XmlBigCount countBytesOutput
      = rootParser->m_accounting.countBytesDirect
        + rootParser->m_accounting.countBytesIndirect;
  const float amplificationFactor
      = accountingGetCurrentAmplification(rootParser);
  const XML_Bool tolerated
      = (countBytesOutput < rootParser->m_accounting.activationThresholdBytes)
        || (amplificationFactor
            <= rootParser->m_accounting.maximumAmplificationFactor);

  if (rootParser->m_accounting.debugLevel >= 2u) {
    accountingReportStats(rootParser, "");
    accountingReportDiff(rootParser, levelsAwayFromRootParser, before, after,
                         bytesMore, source_line, account);
  }

  return tolerated;
}